

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::ExtractVariants(Stage *stage,Dictionary *dict,string *err)

{
  Prim *pPVar1;
  bool bVar2;
  bool bVar3;
  string *in_R9;
  Prim *prim;
  Prim *prim_00;
  string local_50;
  
  if (dict == (Dictionary *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar3 = false;
  }
  else {
    pPVar1 = (stage->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (prim_00 = (stage->_root_nodes).
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_start; bVar3 = prim_00 == pPVar1, !bVar3;
        prim_00 = prim_00 + 1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      bVar2 = anon_unknown_160::ExtractVariantsRec(0,&local_50,prim_00,dict,(uint32_t)err,in_R9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return bVar3;
      }
    }
  }
  return bVar3;
}

Assistant:

bool ExtractVariants(const Stage &stage, Dictionary *dict, std::string *err) {
  if (!dict) {
    if (err) {
      (*err) += "`dict` argument is nullptr.\n";
    }

    return false;
  }

  for (const auto &prim : stage.root_prims()) {
    if (!ExtractVariantsRec(/* depth */ 0, /* root path */ "", prim, (*dict),
                            /* max_depth */ 1024 * 1024, err)) {
      return false;
    }
  }

  return true;
}